

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O2

void __thiscall
Measurement_doubleOps_Test::~Measurement_doubleOps_Test(Measurement_doubleOps_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Measurement, doubleOps)
{
    auto freq = 9.0 / s;
    EXPECT_EQ(freq.units(), one / s);
    auto freq2 = 9.0 * Hz;
    EXPECT_TRUE(freq == freq2);

    auto freq3 = Hz / (1.0 / 9.0);
    EXPECT_TRUE(freq3 == freq2);

    auto fd3 = freq / 3;
    EXPECT_DOUBLE_EQ(fd3.value(), 3.0);

    auto fd9 = freq * 3;
    EXPECT_DOUBLE_EQ(fd9.value(), 27.0);

    auto fd10 = 3.0 * freq;
    EXPECT_DOUBLE_EQ(fd10.value(), 27.0);
    auto fd2 = 27.0 / freq;
    EXPECT_DOUBLE_EQ(fd2.value(), 3.0);
    EXPECT_EQ(fd2.units(), s);

    auto fd11 = (27.0 * m) % 6;
    EXPECT_DOUBLE_EQ(fd11.value(), 3.0);
}